

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::newDecisionLevel(Engine *this)

{
  uint uVar1;
  ostream *poVar2;
  int *piVar3;
  long in_RDI;
  vec<int> *in_stack_00000138;
  int in_stack_ffffffffffffff7c;
  SAT *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  vec<int> *in_stack_ffffffffffffff90;
  string *psVar4;
  int local_40 [4];
  string local_30 [36];
  uint local_c;
  
  Tint::operator++((Tint *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if ((so.debug & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,"Engine::newDecisionLevel\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"  trail_lim size is currently ");
    uVar1 = vec<int>::size((vec<int> *)(in_RDI + 0xe8));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"  pushing ");
    uVar1 = vec<TrailElem>::size((vec<TrailElem> *)(in_RDI + 0xd8));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::operator<<(poVar2," to trail_lim\n");
  }
  local_c = vec<TrailElem>::size((vec<TrailElem> *)(in_RDI + 0xd8));
  vec<int>::push(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if ((so.debug & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"trail_lim is now: ");
    psVar4 = local_30;
    showVec_abi_cxx11_(in_stack_00000138);
    poVar2 = std::operator<<(poVar2,psVar4);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_30);
  }
  SAT::newDecisionLevel(in_stack_ffffffffffffff80);
  if ((so.mip & 1U) != 0) {
    MIP::newDecisionLevel((MIP *)in_stack_ffffffffffffff80);
  }
  piVar3 = (int *)(in_RDI + 0x140);
  local_40[0] = decisionLevel((Engine *)0x2871d4);
  piVar3 = std::max<int>(piVar3,local_40);
  *(int *)(in_RDI + 0x140) = *piVar3;
  return;
}

Assistant:

inline void Engine::newDecisionLevel() {
	trail_inc++;
	if (so.debug) {
		std::cerr << "Engine::newDecisionLevel\n";
		std::cerr << "  trail_lim size is currently " << trail_lim.size() << "\n";
		std::cerr << "  pushing " << trail.size() << " to trail_lim\n";
	}
	trail_lim.push(trail.size());
	if (so.debug) {
		std::cerr << "trail_lim is now: " << showVec(trail_lim) << "\n";
	}
	sat.newDecisionLevel();
	if (so.mip) {
		mip->newDecisionLevel();
	}
	assert(static_cast<int>(dec_info.size()) == decisionLevel());
	peak_depth = std::max(peak_depth, decisionLevel());
}